

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void __thiscall
QMainWindowLayout::hover(QMainWindowLayout *this,QLayoutItem *hoverTarget,QPoint *mousePos)

{
  QMainWindowLayoutState *this_00;
  QMainWindowLayoutState *this_01;
  QArrayDataPointer<int> *this_02;
  int *piVar1;
  undefined1 **ppuVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  compare_eq_result_container<QList<int>,_int> cVar6;
  int iVar7;
  DockWidgetArea DVar8;
  DockPosition DVar9;
  QWidget *pQVar10;
  undefined4 extraout_var;
  QDockWidget *pQVar11;
  QDockWidgetGroupWindow *pQVar12;
  QWidget *pQVar13;
  QWidgetPrivate *pQVar14;
  QScreen *pQVar15;
  QScreen *pQVar16;
  QDockWidgetGroupWindow *pQVar17;
  QLayout *pQVar18;
  QToolBar *this_03;
  QSize QVar19;
  QWidget *pQVar20;
  QTabBar *pQVar21;
  QLoggingCategory *pQVar22;
  QDebug *pQVar23;
  QPoint QVar24;
  long lVar25;
  QWidgetData *pQVar26;
  long lVar27;
  ulong uVar28;
  ToolBarArea area;
  int iVar29;
  QLayoutItem *pQVar30;
  QPoint *pQVar31;
  QWidgetData *pQVar32;
  long lVar33;
  long in_FS_OFFSET;
  QRect QVar34;
  uint local_49c;
  QPoint pos;
  Stream *local_480;
  undefined1 local_478 [8];
  Stream *local_470;
  undefined1 local_468 [8];
  undefined1 local_460 [8];
  undefined1 local_458 [16];
  QArrayDataPointer<QObject_*> local_448;
  QDebug local_428;
  undefined1 local_420 [16];
  QDebug local_410;
  undefined1 local_408 [8];
  undefined1 local_400 [8];
  undefined1 local_3f8 [8];
  QWidget *w;
  QMainWindowLayoutState newState;
  undefined1 local_a8 [8];
  QDockWidget **ppQStack_a0;
  undefined1 **local_98;
  undefined1 *local_90;
  QLayoutItem *pQStack_88;
  QMainWindow *local_80;
  undefined1 *puStack_78;
  undefined1 *local_70;
  int *piStack_68;
  Data *local_60;
  QWidget **ppQStack_58;
  undefined1 *local_50;
  undefined1 *puStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar30 = hoverTarget;
  pQVar10 = QLayout::parentWidget((QLayout *)this);
  iVar29 = (int)pQVar30;
  if ((pQVar10->data->widget_attributes & 0x8000) == 0) goto LAB_004058cb;
  pQVar10 = QLayout::parentWidget((QLayout *)this);
  bVar3 = QWidget::isMinimized(pQVar10);
  if (((bVar3) || (hoverTarget == (QLayoutItem *)0x0)) || (*(long *)(this + 0x7d8) != 0))
  goto LAB_004058cb;
  iVar7 = (*hoverTarget->_vptr_QLayoutItem[0xd])(hoverTarget);
  pQVar10 = (QWidget *)CONCAT44(extraout_var,iVar7);
  QWidget::raise(pQVar10,iVar29);
  if ((((byte)this[0x700] & 0x20) != 0) &&
     ((pQVar11 = QtPrivate::qobject_cast_helper<QDockWidget*,QObject>((QObject *)pQVar10),
      pQVar11 != (QDockWidget *)0x0 ||
      (pQVar12 = QtPrivate::qobject_cast_helper<QDockWidgetGroupWindow*,QObject>((QObject *)pQVar10)
      , pQVar12 != (QDockWidgetGroupWindow *)0x0)))) {
    local_98 = &local_90;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_60 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    ppQStack_58 = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
    local_70 = &DAT_aaaaaaaaaaaaaaaa;
    piStack_68 = (int *)&DAT_aaaaaaaaaaaaaaaa;
    local_80 = (QMainWindow *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_78 = &DAT_aaaaaaaaaaaaaaaa;
    local_90 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_88 = (QLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
    local_a8 = (undefined1  [8])0xa;
    ppQStack_a0 = (QDockWidget **)0x0;
    local_448.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_448.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_448.ptr = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
    pQVar13 = QLayout::parentWidget((QLayout *)this);
    lVar25 = *(long *)&pQVar13->field_0x8;
    local_448.d = *(Data **)(lVar25 + 0x18);
    pQVar32 = *(QWidgetData **)(lVar25 + 0x20);
    local_448.size = *(undefined8 *)(lVar25 + 0x28);
    if (local_448.d != (Data *)0x0) {
      LOCK();
      ((local_448.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_448.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pQVar26 = (QWidgetData *)(&pQVar32->winid + local_448.size);
    local_448.ptr = (QObject **)pQVar32;
    for (; ppuVar2 = local_98, pQVar32 != pQVar26;
        pQVar32 = (QWidgetData *)&pQVar32->widget_attributes) {
      pQVar13 = (QWidget *)pQVar32->winid;
      if (((pQVar13 != (QWidget *)0x0) &&
          ((*(byte *)(*(long *)&pQVar13->field_0x8 + 0x30) & 1) != 0)) &&
         ((w = pQVar13,
          pQVar11 = QtPrivate::qobject_cast_helper<QDockWidget*,QObject>((QObject *)pQVar13),
          pQVar11 != (QDockWidget *)0x0 ||
          (pQVar12 = QtPrivate::qobject_cast_helper<QDockWidgetGroupWindow*,QObject>
                               (&w->super_QObject), pQVar12 != (QDockWidgetGroupWindow *)0x0)))) {
        if ((((w != pQVar10) &&
             (((w->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
               super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)) &&
            ((w->data->widget_attributes & 0x8000) != 0)) &&
           (bVar3 = QWidget::isMinimized(w), !bVar3)) {
          QVarLengthArray<QWidget_*,_10LL>::append((QVarLengthArray<QWidget_*,_10LL> *)local_a8,&w);
        }
        pQVar12 = QtPrivate::qobject_cast_helper<QDockWidgetGroupWindow*,QObject>(&w->super_QObject)
        ;
        if (pQVar12 != (QDockWidgetGroupWindow *)0x0) {
          lVar25 = *(long *)&(pQVar12->super_QWidget).field_0x8;
          piVar1 = *(int **)(lVar25 + 0x18);
          newState.rect.x1.m_i = (int)piVar1;
          newState.rect.y1.m_i = (int)((ulong)piVar1 >> 0x20);
          lVar27 = *(long *)(lVar25 + 0x20);
          newState.rect.x2.m_i = (int)lVar27;
          newState.rect.y2.m_i = (int)((ulong)lVar27 >> 0x20);
          lVar25 = *(long *)(lVar25 + 0x28);
          newState.mainWindow._0_4_ = (undefined4)lVar25;
          newState.mainWindow._4_4_ = (undefined4)((ulong)lVar25 >> 0x20);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + 1;
            UNLOCK();
          }
          for (lVar33 = 0; lVar25 * 8 != lVar33; lVar33 = lVar33 + 8) {
            pQVar13 = &QtPrivate::qobject_cast_helper<QDockWidget*,QObject>
                                 (*(QObject **)(lVar27 + lVar33))->super_QWidget;
            if (((pQVar13 != pQVar10 && pQVar13 != (QWidget *)0x0) &&
                (((pQVar13->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                  super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)) &&
               (((pQVar13->data->widget_attributes & 0x8000) != 0 &&
                (bVar3 = QWidget::isMinimized(pQVar13), !bVar3)))) {
              local_3f8 = (undefined1  [8])pQVar13;
              QVarLengthArray<QWidget*,10ll>::emplace_back<QWidget*>
                        ((QVarLengthArray<QWidget*,10ll> *)local_a8,(QWidget **)local_3f8);
            }
          }
          QArrayDataPointer<QObject_*>::~QArrayDataPointer
                    ((QArrayDataPointer<QObject_*> *)&newState);
        }
      }
    }
    lVar25 = (long)ppQStack_a0 << 3;
    for (lVar27 = 0; lVar25 != lVar27; lVar27 = lVar27 + 8) {
      pQVar12 = *(QDockWidgetGroupWindow **)((long)ppuVar2 + lVar27);
      pQVar14 = qt_widget_private(pQVar10);
      pQVar15 = QWidgetPrivate::associatedScreen(pQVar14);
      pQVar14 = qt_widget_private(&pQVar12->super_QWidget);
      pQVar16 = QWidgetPrivate::associatedScreen(pQVar14);
      if (((pQVar15 == pQVar16) || (pQVar15 == (QScreen *)0x0)) || (pQVar16 == (QScreen *)0x0)) {
        pQVar31 = mousePos;
        cVar4 = QRect::contains((QPoint *)&((pQVar12->super_QWidget).data)->crect,SUB81(mousePos,0))
        ;
        iVar29 = (int)pQVar31;
        if (cVar4 != '\0') {
          pQVar13 = &QtPrivate::qobject_cast_helper<QDockWidget*,QObject>((QObject *)pQVar12)->
                     super_QWidget;
          if (pQVar13 != (QWidget *)0x0) {
            pQVar12 = (QDockWidgetGroupWindow *)QDockWidget::widget((QDockWidget *)pQVar13);
            pQVar17 = QtPrivate::qobject_cast_helper<QDockWidgetGroupWindow*,QObject>
                                ((QObject *)pQVar12);
            if (pQVar17 == (QDockWidgetGroupWindow *)0x0) {
              pQVar12 = createTabbedDockWindow(this);
              QWidget::setGeometry(&pQVar12->super_QWidget,&pQVar13->data->crect);
              pQVar18 = QWidget::layout(&pQVar12->super_QWidget);
              pQVar11 = QtPrivate::qobject_cast_helper<QDockWidget*,QObject>
                                  (&pQVar13->super_QObject);
              if (pQVar11 == (QDockWidget *)0x0) {
                local_49c = 1;
              }
              else {
                pQVar14 = qt_widget_private(pQVar13);
                local_49c = 1;
                if (*(uint *)&pQVar14->field_0x254 < 4) {
                  local_49c = *(uint *)&pQVar14->field_0x254;
                }
              }
              DVar8 = dockWidgetArea(this,pQVar13);
              DVar9 = toDockPos(DVar8);
              if (DVar9 == DockCount) {
                DVar8 = dockWidgetArea(this,pQVar10);
                DVar9 = toDockPos(DVar8);
              }
              uVar28 = (ulong)DVar9;
              if (DVar9 == DockCount) {
                uVar28 = 1;
              }
              pQVar20 = QLayout::parentWidget((QLayout *)this);
              QDockAreaLayoutInfo::QDockAreaLayoutInfo
                        ((QDockAreaLayoutInfo *)&newState,(int *)(this + 0x3a0),(DockPosition)uVar28
                         ,Horizontal,local_49c,(QMainWindow *)pQVar20);
              QDockAreaLayoutInfo::operator=
                        ((QDockAreaLayoutInfo *)&pQVar18[4].super_QLayoutItem,
                         (QDockAreaLayoutInfo *)&newState);
              QDockAreaLayoutInfo::~QDockAreaLayoutInfo((QDockAreaLayoutInfo *)&newState);
              pQVar21 = getTabBar(this);
              pQVar18[7].super_QLayoutItem._vptr_QLayoutItem = (_func_int **)pQVar21;
              pQVar18[7].field_0x8 = 1;
              QDockAreaLayoutInfo::add((QDockAreaLayoutInfo *)&pQVar18[4].super_QLayoutItem,pQVar13)
              ;
              QDockAreaLayoutInfo::add
                        ((QDockAreaLayoutInfo *)(this + uVar28 * 0x70 + 0x1e0),
                         &pQVar12->super_QWidget);
              pQVar17 = pQVar12;
              QWidget::setParent(pQVar13,&pQVar12->super_QWidget);
              iVar29 = (int)pQVar17;
              pQVar22 = QtPrivateLogging::lcQpaDockWidgets();
              if (((pQVar22->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
                newState.toolBarAreaLayout.rect._0_8_ = pQVar22->name;
                newState.rect.x1.m_i = 2;
                newState.rect.y1.m_i = 0;
                newState.rect.x2.m_i = 0;
                newState.rect.y2.m_i = 0;
                newState.mainWindow._0_4_ = 0;
                newState.mainWindow._4_4_ = 0;
                QMessageLogger::debug();
                pQVar23 = QDebug::operator<<((QDebug *)local_3f8,"Wrapping");
                local_460 = (undefined1  [8])pQVar23->stream;
                *(int *)((long)local_460 + 0x28) = *(int *)((long)local_460 + 0x28) + 1;
                ::operator<<((Stream *)&w,(QWidget *)local_460);
                pQVar23 = QDebug::operator<<((QDebug *)&w,"into floating tabs");
                local_458._0_8_ = pQVar23->stream;
                *(int *)(local_458._0_8_ + 0x28) = *(int *)(local_458._0_8_ + 0x28) + 1;
                pQVar20 = (QWidget *)local_458;
                ::operator<<((Stream *)(local_458 + 8),(QWidget *)local_458);
                iVar29 = (int)pQVar20;
                QDebug::~QDebug((QDebug *)(local_458 + 8));
                QDebug::~QDebug((QDebug *)local_458);
                QDebug::~QDebug((QDebug *)&w);
                QDebug::~QDebug((QDebug *)local_460);
                QDebug::~QDebug((QDebug *)local_3f8);
              }
            }
            QWidget::show(pQVar13);
            pQVar22 = QtPrivateLogging::lcQpaDockWidgets();
            if (((pQVar22->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
              newState.toolBarAreaLayout.rect._0_8_ = pQVar22->name;
              newState.rect.x1.m_i = 2;
              newState.rect.y1.m_i = 0;
              newState.rect.x2.m_i = 0;
              newState.rect.y2.m_i = 0;
              newState.mainWindow._0_4_ = 0;
              newState.mainWindow._4_4_ = 0;
              QMessageLogger::debug();
              pQVar23 = QDebug::operator<<((QDebug *)&w,"Showing");
              local_470 = pQVar23->stream;
              *(int *)(local_470 + 0x28) = *(int *)(local_470 + 0x28) + 1;
              pQVar11 = (QDockWidget *)&local_470;
              ::operator<<((Stream *)local_468,(QDockWidget *)&local_470);
              iVar29 = (int)pQVar11;
              QDebug::~QDebug((QDebug *)local_468);
              QDebug::~QDebug((QDebug *)&local_470);
              QDebug::~QDebug((QDebug *)&w);
            }
            QWidget::raise(pQVar10,iVar29);
            pQVar22 = QtPrivateLogging::lcQpaDockWidgets();
            if (((pQVar22->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
              newState.toolBarAreaLayout.rect._0_8_ = pQVar22->name;
              newState.rect.x1.m_i = 2;
              newState.rect.y1.m_i = 0;
              newState.rect.x2.m_i = 0;
              newState.rect.y2.m_i = 0;
              newState.mainWindow._0_4_ = 0;
              newState.mainWindow._4_4_ = 0;
              QMessageLogger::debug();
              pQVar23 = QDebug::operator<<((QDebug *)&w,"Raising");
              local_480 = pQVar23->stream;
              *(int *)(local_480 + 0x28) = *(int *)(local_480 + 0x28) + 1;
              ::operator<<((Stream *)local_478,(QWidget *)&local_480);
              QDebug::~QDebug((QDebug *)local_478);
              QDebug::~QDebug((QDebug *)&local_480);
              QDebug::~QDebug((QDebug *)&w);
            }
          }
          pQVar12 = QtPrivate::qobject_cast_helper<QDockWidgetGroupWindow*,QObject>
                              ((QObject *)pQVar12);
          QVar24 = QWidget::mapFromGlobal(&pQVar12->super_QWidget,mousePos);
          newState.rect.x1.m_i = (int)QVar24.xp.m_i;
          newState.rect.y1.m_i = (int)QVar24.yp.m_i;
          bVar3 = QDockWidgetGroupWindow::hover
                            ((QDockWidgetGroupWindow *)pQVar12,hoverTarget,(QPoint *)&newState);
          if (bVar3) {
            setCurrentHoveredFloat(this,pQVar12);
            applyState(this,(QMainWindowLayoutState *)(this + 0x88),true);
          }
          QArrayDataPointer<QObject_*>::~QArrayDataPointer(&local_448);
          QVarLengthArray<QWidget_*,_10LL>::~QVarLengthArray
                    ((QVarLengthArray<QWidget_*,_10LL> *)local_a8);
          goto LAB_004058cb;
        }
      }
    }
    QArrayDataPointer<QObject_*>::~QArrayDataPointer(&local_448);
    QVarLengthArray<QWidget_*,_10LL>::~QVarLengthArray((QVarLengthArray<QWidget_*,_10LL> *)local_a8)
    ;
  }
  bVar3 = QPointer::operator_cast_to_bool((QPointer *)(this + 0x7f0));
  if (bVar3) {
    QDockWidgetGroupWindow::destroyIfSingleItemLeft(*(QDockWidgetGroupWindow **)(this + 0x7f8));
  }
  setCurrentHoveredFloat(this,(QDockWidgetGroupWindow *)0x0);
  this_00 = (QMainWindowLayoutState *)(this + 0x88);
  this[0x3a4] = (QMainWindowLayout)0x0;
  pos = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  pQVar13 = QLayout::parentWidget((QLayout *)this);
  pos = QWidget::mapFromGlobal(pQVar13,mousePos);
  this_01 = (QMainWindowLayoutState *)(this + 0x3c0);
  if ((*(int *)(this + 0x3c8) < *(int *)(this + 0x3c0)) ||
     (*(int *)(this + 0x3cc) < *(int *)(this + 0x3c4))) {
    QMainWindowLayoutState::operator=(this_01,this_00);
  }
  local_448.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_448.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_448.ptr = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
  QMainWindowLayoutState::gapIndex((QList<int> *)&local_448,this_01,pQVar10,&pos);
  if ((QWidgetData *)local_448.size != (QWidgetData *)0x0) {
    DVar8 = QDockWidgetPrivate::toDockWidgetArea(*(DockPosition *)((long)(WId *)local_448.ptr + 4));
    pQVar11 = QtPrivate::qobject_cast_helper<QDockWidget*,QObject>((QObject *)pQVar10);
    if (pQVar11 == (QDockWidget *)0x0) {
      pQVar12 = QtPrivate::qobject_cast_helper<QDockWidgetGroupWindow*,QObject>((QObject *)pQVar10);
      if (pQVar12 == (QDockWidgetGroupWindow *)0x0) {
        pQVar22 = QtPrivateLogging::lcQpaDockWidgets();
        if (((pQVar22->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
          newState.toolBarAreaLayout.rect._0_8_ = pQVar22->name;
          newState.rect.x1.m_i = 2;
          newState.rect.y1.m_i = 0;
          newState.rect.x2.m_i = 0;
          newState.rect.y2.m_i = 0;
          newState.mainWindow._0_4_ = 0;
          newState.mainWindow._4_4_ = 0;
          QMessageLogger::debug();
          pQVar23 = QDebug::operator<<((QDebug *)local_400,
                                       "Docking requested for invalid widget type (coding error).");
          local_3f8 = (undefined1  [8])pQVar23->stream;
          *(int *)((long)local_3f8 + 0x28) = *(int *)((long)local_3f8 + 0x28) + 1;
          ::operator<<((Stream *)&w,(QWidget *)local_3f8);
          ::operator<<((Stream *)local_a8,(DockWidgetArea)(Stream *)&w);
          QDebug::~QDebug((QDebug *)local_a8);
          QDebug::~QDebug((QDebug *)&w);
          QDebug::~QDebug((QDebug *)local_3f8);
          pQVar23 = (QDebug *)local_400;
          goto LAB_004054a7;
        }
        goto LAB_004054ac;
      }
      local_98 = (undefined1 **)&DAT_aaaaaaaaaaaaaaaa;
      local_a8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      ppQStack_a0 = (QDockWidget **)&DAT_aaaaaaaaaaaaaaaa;
      newState.rect.x1.m_i = 0;
      newState.rect.y1.m_i = 0;
      newState.rect.x2.m_i = 0;
      newState.rect.y2.m_i = 0;
      newState.mainWindow._0_4_ = 0;
      newState.mainWindow._4_4_ = 0;
      QObject::findChildren<QDockWidget*>
                ((QList<QDockWidget_*> *)local_a8,(QObject *)pQVar12,
                 (QAnyStringView)(ZEXT816(0x8000000000000000) << 0x40),(FindChildOptions)0x0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&newState);
      if (local_98 == (undefined1 **)0x1) {
        bVar5 = QDockWidget::isAreaAllowed(*ppQStack_a0,DVar8);
        bVar3 = true;
        if (!bVar5) {
          pQVar22 = QtPrivateLogging::lcQpaDockWidgets();
          if (((pQVar22->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
            newState.toolBarAreaLayout.rect._0_8_ = pQVar22->name;
            newState.rect.x1.m_i = 2;
            newState.rect.y1.m_i = 0;
            newState.rect.x2.m_i = 0;
            newState.rect.y2.m_i = 0;
            newState.mainWindow._0_4_ = 0;
            newState.mainWindow._4_4_ = 0;
            QMessageLogger::debug();
            pQVar23 = QDebug::operator<<(&local_410,"No permission for DockWidgetGroupWindow");
            local_408 = (undefined1  [8])pQVar23->stream;
            *(int *)((long)local_408 + 0x28) = *(int *)((long)local_408 + 0x28) + 1;
            ::operator<<((Stream *)local_400,(QWidget *)local_408);
            pQVar23 = QDebug::operator<<((QDebug *)local_400,"to dock on");
            local_3f8 = (undefined1  [8])pQVar23->stream;
            *(int *)((long)local_3f8 + 0x28) = *(int *)((long)local_3f8 + 0x28) + 1;
            ::operator<<((Stream *)&w,(DockWidgetArea)(QDebug *)local_3f8);
            QDebug::~QDebug((QDebug *)&w);
            QDebug::~QDebug((QDebug *)local_3f8);
            QDebug::~QDebug((QDebug *)local_400);
            QDebug::~QDebug((QDebug *)local_408);
            QDebug::~QDebug(&local_410);
          }
          bVar3 = false;
        }
      }
      else {
        pQVar22 = QtPrivateLogging::lcQpaDockWidgets();
        if (((pQVar22->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
          newState.toolBarAreaLayout.rect._0_8_ = pQVar22->name;
          newState.rect.x1.m_i = 2;
          newState.rect.y1.m_i = 0;
          newState.rect.x2.m_i = 0;
          newState.rect.y2.m_i = 0;
          newState.mainWindow._0_4_ = 0;
          newState.mainWindow._4_4_ = 0;
          QMessageLogger::debug();
          pQVar23 = QDebug::operator<<((QDebug *)local_400,"DockWidgetGroupWindow");
          local_3f8 = (undefined1  [8])pQVar23->stream;
          *(int *)((long)local_3f8 + 0x28) = *(int *)((long)local_3f8 + 0x28) + 1;
          ::operator<<((Stream *)&w,(QWidget *)local_3f8);
          pQVar23 = QDebug::operator<<((QDebug *)&w,"has");
          pQVar23 = QDebug::operator<<(pQVar23,(qint64)local_98);
          QDebug::operator<<(pQVar23,"children:");
          QDebug::~QDebug((QDebug *)&w);
          QDebug::~QDebug((QDebug *)local_3f8);
          QDebug::~QDebug((QDebug *)local_400);
        }
        pQVar22 = QtPrivateLogging::lcQpaDockWidgets();
        if (((pQVar22->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
          newState.toolBarAreaLayout.rect._0_8_ = pQVar22->name;
          newState.rect.x1.m_i = 2;
          newState.rect.y1.m_i = 0;
          newState.rect.x2.m_i = 0;
          newState.rect.y2.m_i = 0;
          newState.mainWindow._0_4_ = 0;
          newState.mainWindow._4_4_ = 0;
          QMessageLogger::debug();
          ::operator<<((Stream *)&w,(QList<QDockWidget_*> *)local_400);
          QDebug::~QDebug((QDebug *)&w);
          QDebug::~QDebug((QDebug *)local_400);
        }
        pQVar22 = QtPrivateLogging::lcQpaDockWidgets();
        bVar3 = true;
        if (((pQVar22->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
          newState.toolBarAreaLayout.rect._0_8_ = pQVar22->name;
          newState.rect.x1.m_i = 2;
          newState.rect.y1.m_i = 0;
          newState.rect.x2.m_i = 0;
          newState.rect.y2.m_i = 0;
          newState.mainWindow._0_4_ = 0;
          newState.mainWindow._4_4_ = 0;
          QMessageLogger::debug();
          pQVar23 = QDebug::operator<<(&local_428,"DockWidgetGroupWindow");
          local_420._0_8_ = pQVar23->stream;
          *(int *)(local_420._0_8_ + 0x28) = *(int *)(local_420._0_8_ + 0x28) + 1;
          ::operator<<((Stream *)(local_420 + 8),(QWidget *)local_420);
          pQVar23 = QDebug::operator<<((QDebug *)(local_420 + 8),"can dock at");
          local_410.stream = pQVar23->stream;
          *(int *)(local_410.stream + 0x28) = *(int *)(local_410.stream + 0x28) + 1;
          ::operator<<((Stream *)local_408,(DockWidgetArea)&local_410);
          QDebug::operator<<((QDebug *)local_408,"and anywhere else.");
          QDebug::~QDebug((QDebug *)local_408);
          QDebug::~QDebug(&local_410);
          QDebug::~QDebug((QDebug *)(local_420 + 8));
          QDebug::~QDebug((QDebug *)local_420);
          QDebug::~QDebug(&local_428);
        }
      }
      QArrayDataPointer<QDockWidget_*>::~QArrayDataPointer
                ((QArrayDataPointer<QDockWidget_*> *)local_a8);
    }
    else {
      bVar5 = QDockWidget::isAreaAllowed(pQVar11,DVar8);
      bVar3 = true;
      if (!bVar5) {
        pQVar22 = QtPrivateLogging::lcQpaDockWidgets();
        if (((pQVar22->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
          newState.toolBarAreaLayout.rect._0_8_ = pQVar22->name;
          newState.rect.x1.m_i = 2;
          newState.rect.y1.m_i = 0;
          newState.rect.x2.m_i = 0;
          newState.rect.y2.m_i = 0;
          newState.mainWindow._0_4_ = 0;
          newState.mainWindow._4_4_ = 0;
          QMessageLogger::debug();
          pQVar23 = QDebug::operator<<((QDebug *)local_408,"No permission for single DockWidget");
          local_400 = (undefined1  [8])pQVar23->stream;
          *(int *)((long)local_400 + 0x28) = *(int *)((long)local_400 + 0x28) + 1;
          ::operator<<((Stream *)local_3f8,(QWidget *)local_400);
          pQVar23 = QDebug::operator<<((QDebug *)local_3f8,"to dock on");
          w = (QWidget *)pQVar23->stream;
          *(int *)(w + 1) = *(int *)(w + 1) + 1;
          ::operator<<((Stream *)local_a8,(DockWidgetArea)(QDebug *)&w);
          QDebug::~QDebug((QDebug *)local_a8);
          QDebug::~QDebug((QDebug *)&w);
          QDebug::~QDebug((QDebug *)local_3f8);
          QDebug::~QDebug((QDebug *)local_400);
          pQVar23 = (QDebug *)local_408;
LAB_004054a7:
          QDebug::~QDebug(pQVar23);
        }
LAB_004054ac:
        bVar3 = false;
      }
    }
    this_03 = QtPrivate::qobject_cast_helper<QToolBar*,QObject>((QObject *)pQVar10);
    if (this_03 != (QToolBar *)0x0) {
      uVar28 = (ulong)*(uint *)((long)(WId *)local_448.ptr + 4);
      area = NoToolBarArea;
      if (uVar28 < 4) {
        area = *(ToolBarArea *)(&DAT_0065a0b0 + uVar28 * 4);
      }
      bVar3 = QToolBar::isAreaAllowed(this_03,area);
    }
    if (bVar3 == false) {
      QList<int>::clear((QList<int> *)&local_448);
    }
  }
  this_02 = (QArrayDataPointer<int> *)(this + 0x7b0);
  cVar6 = QList<int>::operator==((QList<int> *)&local_448,(QList<int> *)this_02);
  if (!cVar6) {
    QArrayDataPointer<int>::operator=(this_02,(QArrayDataPointer<int> *)&local_448);
    if ((QWidgetData *)local_448.size == (QWidgetData *)0x0) {
      fixToolBarOrientation(hoverTarget,2);
      restore(this,true);
    }
    else {
      fixToolBarOrientation(hoverTarget,*(int *)(*(long *)(this + 0x7b8) + 4));
      memset(&newState,0xaa,0x338);
      QMainWindowLayoutState::QMainWindowLayoutState(&newState,this_01);
      bVar3 = QMainWindowLayoutState::insertGap(&newState,(QList<int> *)&local_448,hoverTarget);
      if (((bVar3) &&
          (QVar19 = QMainWindowLayoutState::minimumSize(&newState),
          QVar19.wd.m_i <= (newState.rect.x2.m_i - newState.rect.x1.m_i) + 1)) &&
         (QVar19.ht.m_i <= (newState.rect.y2.m_i - newState.rect.y1.m_i) + 1)) {
        QMainWindowLayoutState::fitLayout(&newState);
        QVar34 = QMainWindowLayoutState::gapRect(&newState,(QList<int> *)this_02);
        *(QRect *)(this + 0x7c8) = QVar34;
        pQVar10 = QLayout::parentWidget((QLayout *)this);
        QDockAreaLayout::separatorRegion((QDockAreaLayout *)local_a8);
        QWidget::update(pQVar10,(QRegion *)local_a8);
        QRegion::~QRegion((QRegion *)local_a8);
        QMainWindowLayoutState::operator=(this_00,&newState);
        applyState(this,this_00,true);
        updateGapIndicator(this);
      }
      else {
        restore(this,true);
      }
      QMainWindowLayoutState::~QMainWindowLayoutState(&newState);
    }
  }
  QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&local_448);
LAB_004058cb:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMainWindowLayout::hover(QLayoutItem *hoverTarget,
                              const QPoint &mousePos) {
  if (!parentWidget()->isVisible() || parentWidget()->isMinimized() ||
      pluggingWidget != nullptr || hoverTarget == nullptr)
    return;

  QWidget *widget = hoverTarget->widget();

#if QT_CONFIG(dockwidget)
    widget->raise();
    if ((dockOptions & QMainWindow::GroupedDragging) && (qobject_cast<QDockWidget*>(widget)
            || qobject_cast<QDockWidgetGroupWindow *>(widget))) {

        // Check if we are over another floating dock widget
        QVarLengthArray<QWidget *, 10> candidates;
        const auto siblings = parentWidget()->children();
        for (QObject *c : siblings) {
            QWidget *w = qobject_cast<QWidget*>(c);
            if (!w)
                continue;

            // Handle only dock widgets and group windows
            if (!qobject_cast<QDockWidget*>(w) && !qobject_cast<QDockWidgetGroupWindow *>(w))
                continue;

            // Check permission to dock on another dock widget or floating dock
            // FIXME in Qt 7

            if (w != widget && w->isWindow() && w->isVisible() && !w->isMinimized())
                candidates << w;

            if (QDockWidgetGroupWindow *group = qobject_cast<QDockWidgetGroupWindow *>(w)) {
                // floating QDockWidgets have a QDockWidgetGroupWindow as a parent,
                // if they have been hovered over
                const auto groupChildren = group->children();
                for (QObject *c : groupChildren) {
                    if (QDockWidget *dw = qobject_cast<QDockWidget*>(c)) {
                        if (dw != widget && dw->isFloating() && dw->isVisible() && !dw->isMinimized())
                            candidates << dw;
                    }
                }
            }
        }

        for (QWidget *w : candidates) {
            const QScreen *screen1 = qt_widget_private(widget)->associatedScreen();
            const QScreen *screen2 = qt_widget_private(w)->associatedScreen();
            if (screen1 && screen2 && screen1 != screen2)
                continue;
            if (!w->geometry().contains(mousePos))
                continue;

#if QT_CONFIG(tabwidget)
            if (auto dropTo = qobject_cast<QDockWidget *>(w)) {

                // w is the drop target's widget
                w = dropTo->widget();

                // Create a floating tab, unless already existing
                if (!qobject_cast<QDockWidgetGroupWindow *>(w)) {
                    QDockWidgetGroupWindow *floatingTabs = createTabbedDockWindow();
                    floatingTabs->setGeometry(dropTo->geometry());
                    QDockAreaLayoutInfo *info = floatingTabs->layoutInfo();
                    const QTabBar::Shape shape = tabwidgetPositionToTabBarShape(dropTo);

                    // dropTo and widget may be in a state where they transition
                    // from being a group window child to a single floating dock widget.
                    // In that case, their path to a main window dock may not have been
                    // updated yet.
                    // => ask both and fall back to dock 1 (right dock)
                    QInternal::DockPosition dockPosition = toDockPos(dockWidgetArea(dropTo));
                    if (dockPosition == QInternal::DockPosition::DockCount)
                        dockPosition = toDockPos(dockWidgetArea(widget));
                    if (dockPosition == QInternal::DockPosition::DockCount)
                        dockPosition = QInternal::DockPosition::RightDock;

                    *info = QDockAreaLayoutInfo(&layoutState.dockAreaLayout.sep, dockPosition,
                                                Qt::Horizontal, shape,
                                                static_cast<QMainWindow *>(parentWidget()));
                    info->tabBar = getTabBar();
                    info->tabbed = true;
                    info->add(dropTo);
                    QDockAreaLayoutInfo &parentInfo = layoutState.dockAreaLayout.docks[dockPosition];
                    parentInfo.add(floatingTabs);
                    dropTo->setParent(floatingTabs);
                    qCDebug(lcQpaDockWidgets) << "Wrapping" << widget << "into floating tabs" << floatingTabs;
                    w = floatingTabs;
                }

                // Show the drop target and raise widget to foreground
                dropTo->show();
                qCDebug(lcQpaDockWidgets) << "Showing" << dropTo;
                widget->raise();
                qCDebug(lcQpaDockWidgets) << "Raising" << widget;
            }
#endif
            auto *groupWindow = qobject_cast<QDockWidgetGroupWindow *>(w);
            Q_ASSERT(groupWindow);
            if (groupWindow->hover(hoverTarget, groupWindow->mapFromGlobal(mousePos))) {
                setCurrentHoveredFloat(groupWindow);
                applyState(layoutState); // update the tabbars
            }
            return;
        }
    }

    // If a temporary group window has been created during a hover,
    // remove it, if it has only one dockwidget child
    if (currentHoveredFloat)
        currentHoveredFloat->destroyIfSingleItemLeft();

    setCurrentHoveredFloat(nullptr);
    layoutState.dockAreaLayout.fallbackToSizeHints = false;
#endif // QT_CONFIG(dockwidget)

    QPoint pos = parentWidget()->mapFromGlobal(mousePos);

    if (!savedState.isValid())
        savedState = layoutState;

    QList<int> path = savedState.gapIndex(widget, pos);

    if (!path.isEmpty()) {
        bool allowed = false;

#if QT_CONFIG(dockwidget)
        allowed = isAreaAllowed(widget, path);
#endif
#if QT_CONFIG(toolbar)
        if (QToolBar *tb = qobject_cast<QToolBar*>(widget))
            allowed = tb->isAreaAllowed(toToolBarArea(path.at(1)));
#endif

        if (!allowed)
            path.clear();
    }

    if (path == currentGapPos)
        return; // the gap is already there

    currentGapPos = path;
    if (path.isEmpty()) {
        fixToolBarOrientation(hoverTarget, 2); // 2 = top dock, ie. horizontal
        restore(true);
        return;
    }

    fixToolBarOrientation(hoverTarget, currentGapPos.at(1));

    QMainWindowLayoutState newState = savedState;

    if (!newState.insertGap(path, hoverTarget)) {
        restore(true); // not enough space
        return;
    }

    QSize min = newState.minimumSize();
    QSize size = newState.rect.size();

    if (min.width() > size.width() || min.height() > size.height()) {
        restore(true);
        return;
    }

    newState.fitLayout();

    currentGapRect = newState.gapRect(currentGapPos);

#if QT_CONFIG(dockwidget)
    parentWidget()->update(layoutState.dockAreaLayout.separatorRegion());
#endif
    layoutState = std::move(newState);
    applyState(layoutState);

    updateGapIndicator();
}